

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phoenix_flm.cpp
# Opt level: O1

void __thiscall phoenix_flm_t::~phoenix_flm_t(phoenix_flm_t *this)

{
  pointer pcVar1;
  
  (this->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__phoenix_flm_t_001850b0;
  std::
  unique_ptr<std::vector<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>_>_>_>_>
  ::~unique_ptr(&this->m_entries);
  pcVar1 = (this->m_signature)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_signature).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

phoenix_flm_t::~phoenix_flm_t() {
    _clean_up();
}